

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSat.c
# Opt level: O0

void Ssc_ManCollectSatPattern(Ssc_Man_t *p,Vec_Int_t *vPattern)

{
  sat_solver *s;
  int iVar1;
  bool bVar2;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vPattern_local;
  Ssc_Man_t *p_local;
  
  Vec_IntClear(vPattern);
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->pFraig->vCis);
    bVar2 = false;
    if (local_24 < iVar1) {
      pGStack_20 = Gia_ManCi(p->pFraig,local_24);
      bVar2 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    s = p->pSat;
    iVar1 = Gia_ObjId(p->pFraig,pGStack_20);
    iVar1 = Ssc_ObjSatVar(p,iVar1);
    iVar1 = sat_solver_var_value(s,iVar1);
    Vec_IntPush(vPattern,iVar1);
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void Ssc_ManCollectSatPattern( Ssc_Man_t * p, Vec_Int_t * vPattern )
{
    Gia_Obj_t * pObj;
    int i;
    Vec_IntClear( vPattern );
    Gia_ManForEachCi( p->pFraig, pObj, i )
        Vec_IntPush( vPattern, sat_solver_var_value(p->pSat, Ssc_ObjSatVar(p, Gia_ObjId(p->pFraig, pObj))) );
}